

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

size_t IndexTools::CalculateNumberOfSequences(size_t o,size_t seqLength)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  
  auVar4 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,o);
  auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,seqLength + 1);
  dVar3 = pow(auVar4._0_8_,auVar1._0_8_);
  auVar4 = vcvtusi2sd_avx512f(in_XMM2,o - 1);
  auVar4._0_8_ = (dVar3 + -1.0) / auVar4._0_8_;
  auVar4._8_8_ = 0;
  sVar2 = vcvttsd2usi_avx512f(auVar4);
  return sVar2;
}

Assistant:

size_t IndexTools::CalculateNumberOfSequences(size_t o, size_t seqLength)
{
    // sequences have length seqLength, 
    // if the number of options(the branching factor) each time-step is o
    // then we get:
    //      sum_t=0...seqLength o^t == (o^(seqLength+1) - 1) / (o - 1)
    // or
    //      sum_t=0...h-1 o^t == (o^h - 1) / (o - 1)
    return( (size_t) 
        (
            ( pow((double)o,(double)(seqLength + 1)) - 1 )
            /   
            ( o - 1 )
        )
    );
}